

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

Node * __thiscall Node::DownLink(Node *this,Node *Node0,int Ptr)

{
  Node *local_30;
  Node *LookDown;
  int Ptr_local;
  Node *Node0_local;
  Node *this_local;
  
  this_local = Node0;
  if ((this != (Node *)0x0) && (this_local = this, Node0 != (Node *)0x0)) {
    if (this->Block[Ptr] == (Node *)0x0) {
      this->Block[Ptr] = Node0;
    }
    else {
      for (local_30 = this->Block[Ptr]; local_30->Block[0] != (Node *)0x0;
          local_30 = local_30->Block[0]) {
      }
      local_30->Block[0] = Node0;
    }
  }
  return this_local;
}

Assistant:

Node *Node::DownLink
(
	Node *Node0,	/**< Node to link in */
	int Ptr		/**< Slot to link it into */
)
{
	//
	// Don't link if nothing to link to
	//
	if (this == 0)
	{
		return(Node0);
	}

	//
	// Skip out if link node is 0
	//
	if (Node0 == 0)
	{
		return this;
	}

	//
	// If we aren't at the top of the stack, scan to the end
	//
	if (Block[Ptr] == 0)
	{
		Block[Ptr] = Node0;
		return this;
	}

	Node* LookDown = Block[Ptr];
	while (LookDown->Block[0] != 0)
	{
		LookDown = LookDown->Block[0];
	}

	//
	// Attach them together
	//
	LookDown->Block[0] = Node0;

	//
	// Return main node back
	//
	return(this);
}